

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O3

void __thiscall xmrig::Miner::Miner(Miner *this,Controller *controller)

{
  IApiListener *pIVar1;
  pointer *pppIVar2;
  pointer *pppIVar3;
  iterator __position;
  iterator iVar4;
  MinerPrivate *pMVar5;
  Api *pAVar6;
  Timer *this_00;
  OclBackend *pOVar7;
  OclBackend *local_38;
  
  pIVar1 = &this->super_IApiListener;
  (this->super_ITimerListener)._vptr_ITimerListener = (_func_int **)&PTR__Miner_001ad650;
  (this->super_IBaseListener)._vptr_IBaseListener = (_func_int **)&PTR__Miner_001ad688;
  (this->super_IApiListener)._vptr_IApiListener = (_func_int **)&PTR__Miner_001ad6b0;
  pMVar5 = (MinerPrivate *)operator_new(0x158);
  pMVar5->active = false;
  pMVar5->enabled = true;
  pMVar5->reset = true;
  pMVar5->controller = controller;
  (pMVar5->job).m_extraIters = 0;
  (pMVar5->job).m_seed.m_data = (char *)0x0;
  (pMVar5->job).m_seed.m_size = 0;
  (pMVar5->job).m_size = 0;
  (pMVar5->job).m_clientId.m_data = (char *)0x0;
  (pMVar5->job).m_clientId.m_size = 0;
  (pMVar5->job).m_extraNonce.m_data = (char *)0x0;
  (pMVar5->job).m_extraNonce.m_size = 0;
  (pMVar5->job).m_id.m_data = (char *)0x0;
  (pMVar5->job).m_id.m_size = 0;
  (pMVar5->job).m_poolWallet.m_data = (char *)0x0;
  *(undefined8 *)((long)&(pMVar5->job).m_poolWallet.m_data + 4) = 0;
  *(undefined8 *)((long)&(pMVar5->job).m_poolWallet.m_size + 4) = 0;
  memset(&(pMVar5->job).m_diff,0,0x99);
  (pMVar5->backends).super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pMVar5->backends).super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pMVar5->backends).super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pMVar5->userJobId).m_data = (char *)0x0;
  (pMVar5->userJobId).m_size = 0;
  pMVar5->timer = (Timer *)0x0;
  pMVar5->ticks = 0;
  this->d_ptr = pMVar5;
  Base::addListener(&controller->super_Base,&this->super_IBaseListener);
  pAVar6 = Base::api(&controller->super_Base);
  __position._M_current =
       (pAVar6->m_listeners).
       super__Vector_base<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38 = (OclBackend *)pIVar1;
  if (__position._M_current ==
      (pAVar6->m_listeners).
      super__Vector_base<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<xmrig::IApiListener*,std::allocator<xmrig::IApiListener*>>::
    _M_realloc_insert<xmrig::IApiListener*const&>
              ((vector<xmrig::IApiListener*,std::allocator<xmrig::IApiListener*>> *)
               &pAVar6->m_listeners,__position,(IApiListener **)&local_38);
  }
  else {
    *__position._M_current = pIVar1;
    pppIVar2 = &(pAVar6->m_listeners).
                super__Vector_base<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar2 = *pppIVar2 + 1;
  }
  this_00 = (Timer *)operator_new(0x10);
  Timer::Timer(this_00,&this->super_ITimerListener);
  pMVar5 = this->d_ptr;
  pMVar5->timer = this_00;
  std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::reserve(&pMVar5->backends,3);
  pMVar5 = this->d_ptr;
  pOVar7 = (OclBackend *)operator_new(0x10);
  CpuBackend::CpuBackend((CpuBackend *)pOVar7,controller);
  iVar4._M_current =
       (pMVar5->backends).super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_38 = pOVar7;
  if (iVar4._M_current ==
      (pMVar5->backends).super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<xmrig::IBackend*,std::allocator<xmrig::IBackend*>>::
    _M_realloc_insert<xmrig::IBackend*>
              ((vector<xmrig::IBackend*,std::allocator<xmrig::IBackend*>> *)&pMVar5->backends,iVar4,
               (IBackend **)&local_38);
  }
  else {
    *iVar4._M_current = (IBackend *)pOVar7;
    pppIVar3 = &(pMVar5->backends).
                super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppIVar3 = *pppIVar3 + 1;
  }
  pMVar5 = this->d_ptr;
  pOVar7 = (OclBackend *)operator_new(0x10);
  OclBackend::OclBackend(pOVar7,controller);
  iVar4._M_current =
       (pMVar5->backends).super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_38 = pOVar7;
  if (iVar4._M_current ==
      (pMVar5->backends).super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<xmrig::IBackend*,std::allocator<xmrig::IBackend*>>::
    _M_realloc_insert<xmrig::IBackend*>
              ((vector<xmrig::IBackend*,std::allocator<xmrig::IBackend*>> *)&pMVar5->backends,iVar4,
               (IBackend **)&local_38);
  }
  else {
    *iVar4._M_current = (IBackend *)pOVar7;
    pppIVar3 = &(pMVar5->backends).
                super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppIVar3 = *pppIVar3 + 1;
  }
  pMVar5 = this->d_ptr;
  pOVar7 = (OclBackend *)operator_new(0x10);
  CudaBackend::CudaBackend((CudaBackend *)pOVar7,controller);
  iVar4._M_current =
       (pMVar5->backends).super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (pMVar5->backends).super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_38 = pOVar7;
    std::vector<xmrig::IBackend*,std::allocator<xmrig::IBackend*>>::
    _M_realloc_insert<xmrig::IBackend*>
              ((vector<xmrig::IBackend*,std::allocator<xmrig::IBackend*>> *)&pMVar5->backends,iVar4,
               (IBackend **)&local_38);
  }
  else {
    *iVar4._M_current = (IBackend *)pOVar7;
    pppIVar3 = &(pMVar5->backends).
                super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppIVar3 = *pppIVar3 + 1;
  }
  return;
}

Assistant:

xmrig::Miner::Miner(Controller *controller)
    : d_ptr(new MinerPrivate(controller))
{
    controller->addListener(this);

#   ifdef XMRIG_FEATURE_API
    controller->api()->addListener(this);
#   endif

    d_ptr->timer = new Timer(this);

    d_ptr->backends.reserve(3);
    d_ptr->backends.push_back(new CpuBackend(controller));

#   ifdef XMRIG_FEATURE_OPENCL
    d_ptr->backends.push_back(new OclBackend(controller));
#   endif

#   ifdef XMRIG_FEATURE_CUDA
    d_ptr->backends.push_back(new CudaBackend(controller));
#   endif
}